

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformprintdevice.cpp
# Opt level: O3

void __thiscall QPlatformPrintDevice::~QPlatformPrintDevice(QPlatformPrintDevice *this)

{
  Data *pDVar1;
  Data *pDVar2;
  Data *pDVar3;
  Data *pDVar4;
  
  this->_vptr_QPlatformPrintDevice = (_func_int **)&PTR__QPlatformPrintDevice_00165588;
  QArrayDataPointer<QMimeType>::~QArrayDataPointer(&(this->m_mimeTypes).d);
  pDVar1 = (this->m_colorModes).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_colorModes).d.d)->super_QArrayData,4,0x10);
    }
  }
  pDVar2 = (this->m_duplexModes).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_duplexModes).d.d)->super_QArrayData,4,0x10);
    }
  }
  QArrayDataPointer<QPrint::OutputBin>::~QArrayDataPointer(&(this->m_outputBins).d);
  QArrayDataPointer<QPrint::InputSlot>::~QArrayDataPointer(&(this->m_inputSlots).d);
  pDVar3 = (this->m_resolutions).d.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_resolutions).d.d)->super_QArrayData,4,0x10);
    }
  }
  QArrayDataPointer<QPageSize>::~QArrayDataPointer(&(this->m_pageSizes).d);
  pDVar4 = (this->m_makeAndModel).d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_makeAndModel).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar4 = (this->m_location).d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_location).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar4 = (this->m_name).d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_name).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar4 = (this->m_id).d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_id).d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

QPlatformPrintDevice::~QPlatformPrintDevice()
{
}